

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCanonicalizeRealPath(LPCSTR lpUnixPath,LPSTR lpBuffer,DWORD cch)

{
  errno_t eVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  bool bVar5;
  int iStack_1058;
  bool fSetFilename;
  DWORD cchCwdBuffer;
  DWORD cchFilename;
  DWORD cchBuffer;
  LPSTR lpFilename;
  LPSTR pchSeparator;
  LPSTR lpExistingPath;
  LPSTR lpRealPath;
  PAL_ERROR palError;
  DWORD cch_local;
  LPSTR lpBuffer_local;
  LPCSTR lpUnixPath_local;
  char pszCwdBuffer [4097];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  lpRealPath._0_4_ = 0;
  lpExistingPath = (LPSTR)0x0;
  if (((lpUnixPath == (LPCSTR)0x0) || (lpBuffer == (LPSTR)0x0)) || (cch < 0x1000)) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    lpRealPath._0_4_ = 0x57;
    goto LAB_0039403c;
  }
  __s = InternalStrdup(lpUnixPath);
  if (__s == (char *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpRealPath._0_4_ = 8;
  }
  else {
    lpFilename = strrchr(__s,0x2f);
    if (lpFilename == (char *)0x0) {
      pcVar2 = getcwd((char *)&lpUnixPath_local,0x1001);
      if (pcVar2 == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        lpRealPath._0_4_ = DIRGetLastErrorFromErrno();
      }
      else {
        lpExistingPath = realpath((char *)&lpUnixPath_local,lpBuffer);
        _cchFilename = __s;
        if (lpExistingPath != (char *)0x0) goto LAB_00393f2e;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        lpRealPath._0_4_ = FILEGetLastErrorFromErrno();
        if (((DWORD)lpRealPath == 2) &&
           (pcVar2 = strstr((char *)&lpUnixPath_local,lpBuffer), pcVar2 != (char *)0x0)) {
          lpRealPath._0_4_ = 3;
        }
      }
    }
    else {
      bVar5 = lpFilename != __s;
      if (bVar5) {
        *lpFilename = '\0';
      }
      else {
        sVar3 = strlen(__s);
        lpFilename = __s + sVar3;
        *lpBuffer = '\0';
      }
      _cchFilename = (char *)0x0;
      lpExistingPath = realpath(__s,lpBuffer);
      if (lpExistingPath == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        lpRealPath._0_4_ = FILEGetLastErrorFromErrno();
        if (((DWORD)lpRealPath == 2) && (pcVar2 = strstr(__s,lpBuffer), pcVar2 != (char *)0x0)) {
          lpRealPath._0_4_ = 3;
        }
      }
      else {
        if (bVar5) {
          _cchFilename = lpFilename + 1;
        }
LAB_00393f2e:
        sVar3 = strlen(lpBuffer);
        if (_cchFilename == (char *)0x0) {
          iStack_1058 = 0;
        }
        else {
          sVar4 = strlen(_cchFilename);
          iStack_1058 = (int)sVar4;
        }
        if (cch < (int)sVar3 + iStack_1058 + 2U) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          lpRealPath._0_4_ = 0x7a;
          lpExistingPath = (LPSTR)0x0;
        }
        else {
          lpBuffer[sVar3 & 0xffffffff] = '/';
          lpBuffer[(int)sVar3 + 1] = '\0';
          if ((_cchFilename != (char *)0x0) &&
             (eVar1 = strcat_s(lpBuffer,(ulong)cch,_cchFilename), eVar1 != 0)) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            lpRealPath._0_4_ = 0x7a;
            lpExistingPath = (LPSTR)0x0;
          }
        }
      }
    }
  }
  if (__s != (char *)0x0) {
    InternalFree(__s);
  }
LAB_0039403c:
  if (((DWORD)lpRealPath == 0) && (lpExistingPath == (LPSTR)0x0)) {
    lpRealPath._0_4_ = 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return (DWORD)lpRealPath;
}

Assistant:

PAL_ERROR
CorUnix::InternalCanonicalizeRealPath(LPCSTR lpUnixPath, LPSTR lpBuffer, DWORD cch)
{
    PAL_ERROR palError = NO_ERROR;
    LPSTR lpRealPath = NULL;

#if !REALPATH_SUPPORTS_NONEXISTENT_FILES
    LPSTR lpExistingPath = NULL;
    LPSTR pchSeparator = NULL;
    LPSTR lpFilename = NULL;
    DWORD cchBuffer = 0;
    DWORD cchFilename = 0;
#endif // !REALPATH_SUPPORTS_NONEXISTENT_FILES
 
    if ( (lpUnixPath == NULL) || (lpBuffer == NULL) || (cch < PATH_MAX) )
    {
        ERROR ("Invalid argument to InternalCanonicalizeRealPath\n");
        palError = ERROR_INVALID_PARAMETER;
        goto LExitDontFree;
    }

#if REALPATH_SUPPORTS_NONEXISTENT_FILES
    lpRealPath = realpath(lpUnixPath, lpBuffer);
#else   // !REALPATH_SUPPORTS_NONEXISTENT_FILES

    lpExistingPath = InternalStrdup(lpUnixPath);
    if (lpExistingPath == NULL)
    {
        ERROR ("InternalStrdup failed with error %d\n", errno);
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto LExit;
    }

    pchSeparator = strrchr(lpExistingPath, '/');
    if (pchSeparator == NULL)
    {
        char pszCwdBuffer[MAXPATHLEN+1]; // MAXPATHLEN is for getcwd()
        DWORD cchCwdBuffer = sizeof(pszCwdBuffer)/sizeof(pszCwdBuffer[0]);

        if (getcwd(pszCwdBuffer, cchCwdBuffer) == NULL)
        {
            WARN("getcwd(NULL) failed with error %d\n", errno);
            palError = DIRGetLastErrorFromErrno();
            goto LExit;
        }

        lpRealPath = realpath(pszCwdBuffer, lpBuffer);
        if (lpRealPath == NULL)
        {
            WARN("realpath() failed with error %d\n", errno);
            palError = FILEGetLastErrorFromErrno();
#if defined(_AMD64_)
            // If we are here, then we tried to invoke realpath
            // against a directory.
            //
            // On Mac64, realpath implementation differs from Mac32
            // by *not* supporting invalid filenames in the path (while
            // Mac32 implementation does).
            //
            // Thus, if we are here, and the error code we see is
            // ERROR_FILE_NOT_FOUND, then we should map it to
            // ERROR_PATH_NOT_FOUND since it was a directory that
            // was not found (and not a file).
            if (palError == ERROR_FILE_NOT_FOUND)
            {
                // Since lpBuffer can be modified by the realpath call,
                // and can result in a truncated subset of the original buffer,
                // we use strstr as a level of safety.
                 if (strstr(pszCwdBuffer, lpBuffer) != 0)
                 {
                     palError = ERROR_PATH_NOT_FOUND;
                 }
            }
#endif // defined(_AMD64_)
            
            goto LExit;
        }
        lpFilename = lpExistingPath;
    }
    else
    {
#if defined(_AMD64_)
        bool fSetFilename = true;
        // Since realpath implementation cannot handle inexistent filenames,
        // check if we are going to truncate the "/" corresponding to the
        // root folder (e.g. case of "/Volumes"). If so:
        //
        // 1) Set the seperator to point to the NULL terminator of the specified
        //    file/folder name.
        //
        // 2) Null terminate lpBuffer
        //
        // 3) Since there is no explicit filename component in lpExistingPath (as
        //    we only have "/" corresponding to the root), set lpFilename to NULL,
        //    alongwith a flag indicating that it has already been set.
        if (pchSeparator == lpExistingPath)
        {
            pchSeparator = lpExistingPath+strlen(lpExistingPath);

            // Set the lpBuffer to NULL
            lpBuffer[0] = '\0';
            lpFilename = NULL;
            fSetFilename = false;
        }
        else
#endif // defined(_AMD64_)
            *pchSeparator = '\0';
            
        lpRealPath = realpath(lpExistingPath, lpBuffer);
        if (lpRealPath == NULL)
        {
            WARN("realpath() failed with error %d\n", errno);
            palError = FILEGetLastErrorFromErrno();

#if defined(_AMD64_)
            // If we are here, then we tried to invoke realpath
            // against a directory after stripping out the filename
            // from the original path.
            //
            // On Mac64, realpath implementation differs from Mac32
            // by *not* supporting invalid filenames in the path (while
            // Mac32 implementation does).
            //
            // Thus, if we are here, and the error code we see is
            // ERROR_FILE_NOT_FOUND, then we should map it to
            // ERROR_PATH_NOT_FOUND since it was a directory that
            // was not found (and not a file).
            if (palError == ERROR_FILE_NOT_FOUND)
            {
                // Since lpBuffer can be modified by the realpath call,
                // and can result in a truncated subset of the original buffer,
                // we use strstr as a level of safety.
                if (strstr(lpExistingPath, lpBuffer) != 0)
                 {
                     palError = ERROR_PATH_NOT_FOUND;
                 }
            }
#endif // defined(_AMD64_)

            goto LExit;
        }

#if defined(_AMD64_)
        if (fSetFilename == true)
#endif // defined(_AMD64_)
            lpFilename = pchSeparator + 1;
    }

    cchBuffer = strlen(lpBuffer);

#if defined(_AMD64_)
    if (lpFilename == NULL)
        cchFilename = 0;
    else
#endif // _AMD64_
        cchFilename = strlen(lpFilename);

    // Append the file name.
    // 2 is for "/" and NULL
    if (cchBuffer + cchFilename + 2 > cch)
    {
        ERROR ("Provided buffer size (%d) is smaller than the required (%d)\n", 
                cch, cchBuffer + cchFilename + 2);
        palError = ERROR_INSUFFICIENT_BUFFER;
        lpRealPath = NULL;
        goto LExit;
    }

    lpBuffer[cchBuffer] = '/';
    lpBuffer[cchBuffer+1] = '\0';

#if defined(_AMD64_)
    if (lpFilename == NULL)
        goto LExit;
#endif // _AMD64_

    if (strcat_s(lpBuffer, cch, lpFilename) != SAFECRT_SUCCESS)
    {
        ERROR ("strcat_s failed!\n");
        palError = ERROR_INSUFFICIENT_BUFFER;
        lpRealPath = NULL;

        // Doing a goto here since we want to exit now. This will work
        // incase someone else adds another if clause below us.
        goto LExit;
    }

LExit:
    if (lpExistingPath != NULL)
    {
        InternalFree(lpExistingPath);
    }
#endif // REALPATH_SUPPORTS_NONEXISTENT_FILES

LExitDontFree:
    if ((palError == NO_ERROR) && (lpRealPath == NULL))
    {
        // convert all these into ERROR_PATH_NOT_FOUND
        palError = ERROR_PATH_NOT_FOUND;
    }

    return palError;
}